

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSElementDeclaration * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,SchemaElementDecl *elemDecl,XSModel *xsModel,
          XSComplexTypeDefinition *enclosingTypeDef)

{
  int iVar1;
  int iVar2;
  PSVIScope PVar3;
  XSComplexTypeDefinition *pXVar4;
  SchemaElementDecl *pSVar5;
  ComplexTypeInfo *pCVar6;
  DatatypeValidator *pDVar7;
  XSIDCDefinition *maxElems;
  XMLStringPool *uriStringPool;
  IdentityConstraint *ic;
  XSIDCDefinition *toAdd;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XSAnnotation *annot;
  XSTypeDefinition *typeDefinition;
  SCOPE local_84;
  SCOPE elemScope;
  XSIDCDefinition *icDef;
  XMLSize_t i;
  XMLSize_t count;
  XSNamedMap<xercesc_4_0::XSIDCDefinition> *icMap;
  XSTypeDefinition *xsType;
  XSElementDeclaration *xsSubElem;
  XSElementDeclaration *xsObj;
  XSComplexTypeDefinition *enclosingTypeDef_local;
  XSModel *xsModel_local;
  SchemaElementDecl *elemDecl_local;
  XSObjectFactory *this_local;
  
  xsSubElem = (XSElementDeclaration *)XSModel::getXSObject(xsModel,elemDecl);
  if (xsSubElem == (XSElementDeclaration *)0x0) {
    xsType = (XSTypeDefinition *)0x0;
    icMap = (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)0x0;
    count = 0;
    pSVar5 = SchemaElementDecl::getSubstitutionGroupElem(elemDecl);
    if (pSVar5 != (SchemaElementDecl *)0x0) {
      pSVar5 = SchemaElementDecl::getSubstitutionGroupElem(elemDecl);
      xsType = (XSTypeDefinition *)addOrFind(this,pSVar5,xsModel,(XSComplexTypeDefinition *)0x0);
    }
    pCVar6 = SchemaElementDecl::getComplexTypeInfo(elemDecl);
    if ((pCVar6 == (ComplexTypeInfo *)0x0) &&
       (pDVar7 = SchemaElementDecl::getDatatypeValidator(elemDecl),
       pDVar7 != (DatatypeValidator *)0x0)) {
      pDVar7 = SchemaElementDecl::getDatatypeValidator(elemDecl);
      icMap = (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)addOrFind(this,pDVar7,xsModel,false);
    }
    maxElems = (XSIDCDefinition *)SchemaElementDecl::getIdentityConstraintCount(elemDecl);
    if (maxElems != (XSIDCDefinition *)0x0) {
      count = (XMLSize_t)XMemory::operator_new(0x20,this->fMemoryManager);
      uriStringPool = XSModel::getURIStringPool(xsModel);
      XSNamedMap<xercesc_4_0::XSIDCDefinition>::XSNamedMap
                ((XSNamedMap<xercesc_4_0::XSIDCDefinition> *)count,(XMLSize_t)maxElems,0x1d,
                 uriStringPool,false,this->fMemoryManager);
      for (icDef = (XSIDCDefinition *)0x0; icDef < maxElems;
          icDef = (XSIDCDefinition *)((long)&(icDef->super_XSObject)._vptr_XSObject + 1)) {
        ic = SchemaElementDecl::getIdentityConstraintAt(elemDecl,(XMLSize_t)icDef);
        toAdd = addOrFind(this,ic,xsModel);
        if (toAdd != (XSIDCDefinition *)0x0) {
          iVar1 = (*(toAdd->super_XSObject)._vptr_XSObject[2])();
          iVar2 = (*(toAdd->super_XSObject)._vptr_XSObject[3])();
          XSNamedMap<xercesc_4_0::XSIDCDefinition>::addElement
                    ((XSNamedMap<xercesc_4_0::XSIDCDefinition> *)count,toAdd,
                     (XMLCh *)CONCAT44(extraout_var,iVar1),(XMLCh *)CONCAT44(extraout_var_00,iVar2))
          ;
        }
      }
    }
    PVar3 = SchemaElementDecl::getPSVIScope(elemDecl);
    if (PVar3 == SCP_LOCAL) {
      local_84 = SCOPE_LOCAL;
    }
    else {
      PVar3 = SchemaElementDecl::getPSVIScope(elemDecl);
      local_84 = (SCOPE)(PVar3 == SCP_GLOBAL);
    }
    xsSubElem = (XSElementDeclaration *)XMemory::operator_new(0x60,this->fMemoryManager);
    annot = getAnnotationFromModel(this,xsModel,elemDecl);
    XSElementDeclaration::XSElementDeclaration
              (xsSubElem,elemDecl,(XSTypeDefinition *)icMap,(XSElementDeclaration *)xsType,annot,
               (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)count,xsModel,local_84,enclosingTypeDef,
               this->fMemoryManager);
    putObjectInMap(this,elemDecl,(XSObject *)xsSubElem);
    pCVar6 = SchemaElementDecl::getComplexTypeInfo(elemDecl);
    if (pCVar6 == (ComplexTypeInfo *)0x0) {
      if (icMap == (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)0x0) {
        typeDefinition =
             XSModel::getTypeDefinition
                       (xsModel,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE,
                        (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        XSElementDeclaration::setTypeDefinition(xsSubElem,typeDefinition);
      }
    }
    else {
      pCVar6 = SchemaElementDecl::getComplexTypeInfo(elemDecl);
      pXVar4 = addOrFind(this,pCVar6,xsModel);
      XSElementDeclaration::setTypeDefinition(xsSubElem,&pXVar4->super_XSTypeDefinition);
    }
  }
  else {
    pXVar4 = XSElementDeclaration::getEnclosingCTDefinition(xsSubElem);
    if ((pXVar4 == (XSComplexTypeDefinition *)0x0) &&
       (enclosingTypeDef != (XSComplexTypeDefinition *)0x0)) {
      XSElementDeclaration::setEnclosingCTDefinition(xsSubElem,enclosingTypeDef);
    }
  }
  return xsSubElem;
}

Assistant:

XSElementDeclaration*
XSObjectFactory::addOrFind(SchemaElementDecl* const elemDecl,
                           XSModel* const xsModel,
                           XSComplexTypeDefinition* const enclosingTypeDef)
{
    XSElementDeclaration* xsObj = (XSElementDeclaration*) xsModel->getXSObject(elemDecl);
    if (xsObj)
    {
        if (!xsObj->getEnclosingCTDefinition() && enclosingTypeDef)
            xsObj->setEnclosingCTDefinition(enclosingTypeDef);
    }
    else
    {
        XSElementDeclaration*        xsSubElem = 0;
        XSTypeDefinition*            xsType = 0;
        XSNamedMap<XSIDCDefinition>* icMap = 0;

        if (elemDecl->getSubstitutionGroupElem())
            xsSubElem = addOrFind(elemDecl->getSubstitutionGroupElem(), xsModel);

        // defer checking for complexTypeInfo until later as it could
        // eventually need this elemement
        // but don't check simple type unless no complexTypeInfo present
        if (!elemDecl->getComplexTypeInfo() && elemDecl->getDatatypeValidator())
            xsType = addOrFind(elemDecl->getDatatypeValidator(), xsModel);

        XMLSize_t count = elemDecl->getIdentityConstraintCount();
        if (count)
        {
            //REVISIT: size of hash table....
            icMap = new (fMemoryManager) XSNamedMap<XSIDCDefinition>
            (
                count
                , 29
                , xsModel->getURIStringPool()
                , false
                , fMemoryManager
            );

            for (XMLSize_t i = 0; i < count; i++)
            {
                XSIDCDefinition* icDef = addOrFind
                (
                    elemDecl->getIdentityConstraintAt(i)
                    , xsModel
                );
                if (icDef)
                {
                    icMap->addElement
                    (
                        icDef
                        , icDef->getName()
                        , icDef->getNamespace()
                    );
                }
            }
        }

        XSConstants::SCOPE elemScope = XSConstants::SCOPE_ABSENT;
        if (elemDecl->getPSVIScope() == PSVIDefs::SCP_LOCAL)
            elemScope = XSConstants::SCOPE_LOCAL;
        else if (elemDecl->getPSVIScope() == PSVIDefs::SCP_GLOBAL)
            elemScope = XSConstants::SCOPE_GLOBAL;

        xsObj = new (fMemoryManager) XSElementDeclaration
        (
            elemDecl
            , xsType
            , xsSubElem
            , getAnnotationFromModel(xsModel, elemDecl)
            , icMap
            , xsModel
            , elemScope
            , enclosingTypeDef
            , fMemoryManager
        );
        putObjectInMap(elemDecl, xsObj);

        if (elemDecl->getComplexTypeInfo())
        {
            xsType = addOrFind(elemDecl->getComplexTypeInfo(), xsModel);
            xsObj->setTypeDefinition(xsType);
        }
        else if (!xsType)
        {
            xsType = xsModel->getTypeDefinition
            (
                SchemaSymbols::fgATTVAL_ANYTYPE
                , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
            );
            xsObj->setTypeDefinition(xsType);
        }
    }

    return xsObj;
}